

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

int __thiscall
QTzTimeZonePrivate::daylightTimeOffset(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long lVar1;
  long in_FS_OFFSET;
  qint64 in_stack_00000080;
  QTzTimeZonePrivate *in_stack_00000088;
  undefined4 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data(in_stack_00000088,in_stack_00000080);
  QTimeZonePrivate::Data::~Data((Data *)0x74d499);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

int QTzTimeZonePrivate::daylightTimeOffset(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).daylightTimeOffset;
}